

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttf.c
# Opt level: O0

int ttf_char_length(ALLEGRO_FONT *f,int ch)

{
  _Bool _Var1;
  int iVar2;
  int in_ESI;
  undefined8 *in_RDI;
  int ft_index;
  ALLEGRO_TTF_FONT_DATA *unaff_retaddr;
  FT_Face_conflict face;
  ALLEGRO_TTF_GLYPH_DATA *glyph;
  ALLEGRO_TTF_FONT_DATA *data;
  int result;
  long local_28;
  undefined8 *puVar3;
  undefined1 lock_whole_page;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  puVar3 = (undefined8 *)*in_RDI;
  FT_Get_Char_Index(*puVar3,(long)in_ESI);
  lock_whole_page = (undefined1)((ulong)puVar3 >> 0x38);
  _Var1 = get_glyph((ALLEGRO_TTF_FONT_DATA *)
                    CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                    (int)((ulong)in_RDI >> 0x20),
                    (ALLEGRO_TTF_GLYPH_DATA **)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
  if (!_Var1) {
    if (in_RDI[2] != 0) {
      iVar2 = al_get_glyph_width(in_RDI,in_ESI);
      return iVar2;
    }
    get_glyph((ALLEGRO_TTF_FONT_DATA *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
              ,(int)((ulong)in_RDI >> 0x20),
              (ALLEGRO_TTF_GLYPH_DATA **)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
  }
  cache_glyph(unaff_retaddr,
              (FT_Face_conflict)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
              (int)((ulong)in_RDI >> 0x20),
              (ALLEGRO_TTF_GLYPH_DATA *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
              (_Bool)lock_whole_page);
  return *(short *)(local_28 + 0xc) + -2;
}

Assistant:

static int ttf_char_length(ALLEGRO_FONT const *f, int ch)
{
   int result;
   ALLEGRO_TTF_FONT_DATA *data = f->data;
   ALLEGRO_TTF_GLYPH_DATA *glyph;
   FT_Face face = data->face;
   int ft_index = FT_Get_Char_Index(face, ch);
   if (!get_glyph(data, ft_index, &glyph)) {
      if (f->fallback) {
         return al_get_glyph_width(f, ch);
      }
      else {
         get_glyph(data, 0, &glyph);
         ft_index = 0;
      }
   }
   cache_glyph(data, face, ft_index, glyph, false);
   result = glyph->region.w - 2;

   return result;
}